

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase1294::run(TestCase1294 *this)

{
  PromiseArena *pPVar1;
  char *pcVar2;
  OwnPromiseNode OVar3;
  void *pvVar4;
  TransformPromiseNodeBase *this_00;
  bool called;
  DebugExpression<bool> _kjCondition;
  Promise<void> promise;
  WaitScope waitScope;
  EventLoop loop;
  undefined1 local_119;
  SourceLocation local_118;
  OwnPromiseNode local_100;
  OwnPromiseNode local_f8;
  EventLoop *local_f0;
  byte local_e8 [8];
  long local_e0;
  byte abStack_d8 [8];
  char *local_d0;
  char *pcStack_c8;
  byte local_c0 [8];
  char *local_b8;
  char *pcStack_b0;
  byte local_a8 [8];
  EventLoop local_a0;
  
  local_119 = '\0';
  EventLoop::EventLoop(&local_a0);
  local_e8[0] = 0xff;
  local_e8[1] = 0xff;
  local_e8[2] = 0xff;
  local_e8[3] = 0xff;
  local_e0 = 0;
  abStack_d8[0] = '\0';
  abStack_d8[1] = '\0';
  abStack_d8[2] = '\0';
  abStack_d8[3] = '\0';
  abStack_d8[4] = '\0';
  abStack_d8[5] = '\0';
  abStack_d8[6] = '\0';
  abStack_d8[7] = '\0';
  local_f0 = &local_a0;
  EventLoop::enterScope(&local_a0);
  kj::_::readyNow();
  pcVar2 = local_118.fileName;
  local_f8.ptr = (PromiseNode *)local_118.fileName;
  pPVar1 = *(PromiseArena **)((long)local_118.fileName + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_118.fileName - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_f8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1300:57)>
               ::anon_class_8_1_4f9d58bb_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_006286a0;
    *(undefined1 **)((long)pvVar4 + 0x3f8) = &local_119;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(PromiseArena **)((long)local_118.fileName + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_118.fileName + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_f8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1300:57)>
               ::anon_class_8_1_4f9d58bb_for_func::operator());
    ((PromiseArenaMember *)((long)pcVar2 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006286a0;
    ((PromiseArenaMember *)((long)pcVar2 + -0x10))->arena = (PromiseArena *)&local_119;
    ((PromiseArenaMember *)((long)pcVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  OVar3.ptr = local_f8.ptr;
  local_100.ptr = &this_00->super_PromiseNode;
  if (&(local_f8.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_f8.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  yield();
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_b0 = "run";
  local_a8[0] = '\x17';
  local_a8[1] = '\x05';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\x03';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  Promise<void>::wait((Promise<void> *)&local_118,&local_f0);
  pcVar2 = local_118.fileName;
  if ((PromiseArenaMember *)local_118.fileName != (PromiseArenaMember *)0x0) {
    local_118.fileName = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar2);
  }
  local_118.fileName = (char *)(CONCAT71(local_118.fileName._1_7_,local_119) ^ 1);
  if ((local_119 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x519,ERROR,"\"failed: expected \" \"!(called)\", _kjCondition",
               (char (*) [27])"failed: expected !(called)",(DebugExpression<bool> *)&local_118);
  }
  local_118.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  local_118.function = "run";
  local_118.lineNumber = 0x51b;
  local_118.columnNumber = 0xd;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_f8,&local_100,&local_118);
  OVar3.ptr = local_100.ptr;
  local_100.ptr = local_f8.ptr;
  if ((TransformPromiseNodeBase *)OVar3.ptr != (TransformPromiseNodeBase *)0x0) {
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  yield();
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_c8 = "run";
  local_c0[0] = '\x1d';
  local_c0[1] = '\x05';
  local_c0[2] = '\0';
  local_c0[3] = '\0';
  local_c0[4] = '\x03';
  local_c0[5] = '\0';
  local_c0[6] = '\0';
  local_c0[7] = '\0';
  Promise<void>::wait((Promise<void> *)&local_118,&local_f0);
  pcVar2 = local_118.fileName;
  if ((PromiseArenaMember *)local_118.fileName != (PromiseArenaMember *)0x0) {
    local_118.fileName = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar2);
  }
  local_118.fileName = &local_119;
  if ((local_119 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[24],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x51f,ERROR,"\"failed: expected \" \"called\", _kjCondition",
               (char (*) [24])"failed: expected called",(DebugExpression<bool_&> *)&local_118);
  }
  OVar3.ptr = local_100.ptr;
  if (&(local_100.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_100.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  if (local_e0 == 0) {
    EventLoop::leaveScope(local_f0);
  }
  EventLoop::~EventLoop(&local_a0);
  return;
}

Assistant:

TEST(Async, EagerlyEvaluate) {
  bool called = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = Promise<void>(READY_NOW).then([&]() {
    called = true;
  });
  yield().wait(waitScope);

  EXPECT_FALSE(called);

  promise = promise.eagerlyEvaluate(nullptr);

  yield().wait(waitScope);

  EXPECT_TRUE(called);
}